

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O2

t_int * voutlet_doepilog_resampling(t_int *w)

{
  long lVar1;
  t_int tVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  
  lVar1 = w[1];
  tVar2 = w[2];
  puVar4 = *(undefined4 **)(lVar1 + 0x58);
  lVar3 = *(long *)(lVar1 + 0x90);
  for (lVar5 = 0; (int)tVar2 != (int)lVar5; lVar5 = lVar5 + 1) {
    *(undefined4 *)(lVar3 + lVar5 * 4) = *puVar4;
    *puVar4 = 0;
    puVar4 = puVar4 + 1;
  }
  if (puVar4 == *(undefined4 **)(lVar1 + 0x50)) {
    puVar4 = *(undefined4 **)(lVar1 + 0x48);
  }
  *(undefined4 **)(lVar1 + 0x58) = puVar4;
  return w + 3;
}

Assistant:

static t_int *voutlet_doepilog_resampling(t_int *w)
{
    t_voutlet *x = (t_voutlet *)(w[1]);
    int n = (int)(w[2]);
    t_sample *in  = x->x_empty;
    t_sample *out = x->x_updown.s_vec;
    for (; n--; in++) *out++ = *in, *in = 0;
    if (in == x->x_endbuf) in = x->x_buf;
    x->x_empty = in;
    return (w+3);
}